

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.c
# Opt level: O2

_Bool ThingDestroy(Thing *thing)

{
  if (thing == (Thing *)0x0) {
    fprintf(_stderr,"%s: trying to free null pointer, ignored.\n","ThingDestroy");
  }
  else {
    free(thing);
  }
  return thing != (Thing *)0x0;
}

Assistant:

bool ThingDestroy(Thing *thing) {
  if (thing == NULL) {
#ifndef NDEBUG
    fprintf(stderr, "%s: trying to free null pointer, ignored.\n", __FUNCTION_NAME__);
#endif
    return false;
  }
  free(thing);
  return true;
}